

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O1

int rxa2_allocate_memory(argon2_context *context,uint8_t **memory,size_t num,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t __size;
  uint8_t *puVar3;
  int iVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = num;
  __size = SUB168(auVar1 * auVar2,0);
  iVar4 = -0x16;
  if (memory != (uint8_t **)0x0 && SUB168(auVar1 * auVar2,8) == 0) {
    if (context->allocate_cbk == (allocate_fptr)0x0) {
      puVar3 = (uint8_t *)malloc(__size);
      *memory = puVar3;
    }
    else {
      (*context->allocate_cbk)(memory,__size);
    }
    iVar4 = -0x16;
    if (*memory != (uint8_t *)0x0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int rxa2_allocate_memory(const argon2_context *context, uint8_t **memory,
	size_t num, size_t size) {
	size_t memory_size = num * size;
	if (memory == NULL) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	/* 1. Check for multiplication overflow */
	if (size != 0 && memory_size / size != num) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	/* 2. Try to allocate with appropriate allocator */
	if (context->allocate_cbk) {
		(context->allocate_cbk)(memory, memory_size);
	}
	else {
		*memory = (uint8_t*)malloc(memory_size);
	}

	if (*memory == NULL) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	return ARGON2_OK;
}